

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  lVar1 = *(long *)(*(long *)(*arguments + 0x60) + 0x78);
  uVar3 = *(ulong *)(lVar1 + 0x20);
  if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
    sVar6 = (sysbvm_tuple_t)(*(uint *)(uVar3 + 0xc) >> 3);
  }
  else {
    sVar6 = 0;
  }
  sVar2 = sysbvm_array_create(context,sVar6);
  if (sVar6 != 0) {
    sVar5 = 0;
    do {
      uVar3 = *(ulong *)(lVar1 + 0x20);
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        uVar3 = *(ulong *)(uVar3 + 0x10 + sVar5 * 8);
      }
      else {
        uVar3 = 0;
      }
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar3 + 0x48);
      }
      else {
        sVar4 = 0;
      }
      sVar4 = sysbvm_environment_evaluateSymbolBinding(context,arguments[1],sVar4);
      if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
        *(sysbvm_tuple_t *)(sVar2 + 0x10 + sVar5 * 8) = sVar4;
      }
      sVar5 = sVar5 + 1;
    } while (sVar6 != sVar5);
  }
  sVar2 = sysbvm_function_createClosureWithCaptureVector
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x60),sVar2);
  sVar6 = *(sysbvm_tuple_t *)(*arguments + 0x68);
  if (sVar6 != 0) {
    sysbvm_functionActivationEnvironment_setBindingActivationValue
              (context,arguments[1],sVar6,sVar2,*(sysbvm_tuple_t *)(*arguments + 0x10));
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;

    sysbvm_functionDefinition_t *functionDefinition = (sysbvm_functionDefinition_t*)(*lambdaNode)->functionDefinition;
    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinition->sourceAnalyzedDefinition;

    size_t captureVectorSize = sysbvm_array_getSize(sourceAnalyzedDefinition->captures);
    sysbvm_tuple_t captureVector = sysbvm_array_create(context, captureVectorSize);
    for(size_t i = 0; i < captureVectorSize; ++i)
    {
        sysbvm_tuple_t captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(sourceAnalyzedDefinition->captures, i));
        sysbvm_tuple_t captureValue = sysbvm_environment_evaluateSymbolBinding(context, *environment, captureBinding);
        sysbvm_array_atPut(captureVector, i, captureValue);
    }

    sysbvm_tuple_t lambdaClosure = sysbvm_function_createClosureWithCaptureVector(context, (*lambdaNode)->functionDefinition, captureVector);
    if((*lambdaNode)->binding)
        sysbvm_functionActivationEnvironment_setBindingActivationValue(context, *environment, (*lambdaNode)->binding, lambdaClosure, (*lambdaNode)->super.sourcePosition);
    return lambdaClosure;
}